

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

int __thiscall icu_63::Locale::init(Locale *this,EVP_PKEY_CTX *ctx)

{
  UBool UVar1;
  Locale *other;
  char *pcVar2;
  char in_DL;
  int32_t local_a0;
  int local_9c;
  char *sep2;
  UErrorCode err;
  int32_t length;
  int32_t variantField;
  int32_t fieldIdx;
  int32_t fieldLen [5];
  char *local_58;
  char *field [5];
  char *separator;
  UBool canonicalize_local;
  char *localeID_local;
  Locale *this_local;
  
  this->fIsBogus = '\0';
  if (this->baseName != this->fullName) {
    uprv_free_63(this->baseName);
  }
  this->baseName = (char *)0x0;
  if (this->fullName != this->fullNameBuffer) {
    uprv_free_63(this->fullName);
    this->fullName = this->fullNameBuffer;
  }
  memset(&local_58,0,0x28);
  memset(&variantField,0,0x14);
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    other = getDefault();
    this_local = operator=(this,other);
    goto LAB_003ebf7b;
  }
  this->country[0] = '\0';
  this->script[0] = '\0';
  this->language[0] = '\0';
  sep2._0_4_ = U_ZERO_ERROR;
  if (in_DL == '\0') {
    local_9c = uloc_getName_63((char *)ctx,this->fullName,0x9d,(UErrorCode *)&sep2);
  }
  else {
    local_9c = uloc_canonicalize_63((char *)ctx,this->fullName,0x9d,(UErrorCode *)&sep2);
  }
  sep2._4_4_ = local_9c;
  this_local = this;
  if (((UErrorCode)sep2 == U_BUFFER_OVERFLOW_ERROR) || (0x9c < local_9c)) {
    pcVar2 = (char *)uprv_malloc_63((long)(local_9c + 1));
    this->fullName = pcVar2;
    if (this->fullName != (char *)0x0) {
      sep2._0_4_ = U_ZERO_ERROR;
      if (in_DL == '\0') {
        local_a0 = uloc_getName_63((char *)ctx,this->fullName,sep2._4_4_ + 1,(UErrorCode *)&sep2);
      }
      else {
        local_a0 = uloc_canonicalize_63
                             ((char *)ctx,this->fullName,sep2._4_4_ + 1,(UErrorCode *)&sep2);
      }
      sep2._4_4_ = local_a0;
      goto LAB_003ebbc3;
    }
    this->fullName = this->fullNameBuffer;
  }
  else {
LAB_003ebbc3:
    UVar1 = ::U_FAILURE((UErrorCode)sep2);
    if ((UVar1 == '\0') && ((UErrorCode)sep2 != U_STRING_NOT_TERMINATED_WARNING)) {
      this->variantBegin = sep2._4_4_;
      local_58 = this->fullName;
      field[4] = this->fullName;
      length = 1;
      while( true ) {
        field[4] = strchr(field[(long)(length + -1) + -1],0x5f);
        if (field[4] == (char *)0x0 || 3 < length) break;
        field[(long)length + -1] = field[4] + 1;
        (&variantField)[length + -1] = (int)field[4] - (int)field[(long)(length + -1) + -1];
        length = length + 1;
      }
      field[4] = strchr(field[(long)(length + -1) + -1],0x40);
      pcVar2 = strchr(field[(long)(length + -1) + -1],0x2e);
      if ((field[4] == (char *)0x0) && (pcVar2 == (char *)0x0)) {
        (&variantField)[length + -1] =
             sep2._4_4_ - ((int)field[(long)(length + -1) + -1] - (int)this->fullName);
      }
      else {
        if ((field[4] == (char *)0x0) || ((pcVar2 != (char *)0x0 && (pcVar2 < field[4])))) {
          field[4] = pcVar2;
        }
        (&variantField)[length + -1] = (int)field[4] - (int)field[(long)(length + -1) + -1];
      }
      if (variantField < 0xc) {
        err = U_ILLEGAL_ARGUMENT_ERROR;
        if (0 < variantField) {
          memcpy(this->language,this->fullName,(long)variantField);
          this->language[variantField] = '\0';
        }
        if ((((fieldIdx == 4) &&
             ((('`' < *field[0] && (*field[0] < '{')) || (('@' < *field[0] && (*field[0] < '['))))))
            && ((('`' < field[0][1] && (field[0][1] < '{')) ||
                (('@' < field[0][1] && (field[0][1] < '[')))))) &&
           (((('`' < field[0][2] && (field[0][2] < '{')) ||
             (('@' < field[0][2] && (field[0][2] < '[')))) &&
            ((('`' < field[0][3] && (field[0][3] < '{')) ||
             (('@' < field[0][3] && (field[0][3] < '[')))))))) {
          memcpy(this->script,field[0],4);
          this->script[fieldIdx] = '\0';
          err = err + U_ILLEGAL_ARGUMENT_ERROR;
        }
        if (((&variantField)[err] == 2) || ((&variantField)[err] == 3)) {
          memcpy(this->country,field[(long)err + -1],(long)(&variantField)[err]);
          this->country[(&variantField)[err]] = '\0';
          err = err + U_ILLEGAL_ARGUMENT_ERROR;
        }
        else if ((&variantField)[err] == 0) {
          err = err + U_ILLEGAL_ARGUMENT_ERROR;
        }
        if (0 < (&variantField)[err]) {
          this->variantBegin = (int)field[(long)err + -1] - (int)this->fullName;
        }
        sep2._0_4_ = U_ZERO_ERROR;
        initBaseName(this,(UErrorCode *)&sep2);
        UVar1 = ::U_FAILURE((UErrorCode)sep2);
        if (UVar1 == '\0') goto LAB_003ebf7b;
      }
    }
  }
  setToBogus(this);
LAB_003ebf7b:
  return (int)this_local;
}

Assistant:

Locale& Locale::init(const char* localeID, UBool canonicalize)
{
    fIsBogus = FALSE;
    /* Free our current storage */
    if (baseName != fullName) {
        uprv_free(baseName);
    }
    baseName = NULL;
    if(fullName != fullNameBuffer) {
        uprv_free(fullName);
        fullName = fullNameBuffer;
    }

    // not a loop:
    // just an easy way to have a common error-exit
    // without goto and without another function
    do {
        char *separator;
        char *field[5] = {0};
        int32_t fieldLen[5] = {0};
        int32_t fieldIdx;
        int32_t variantField;
        int32_t length;
        UErrorCode err;

        if(localeID == NULL) {
            // not an error, just set the default locale
            return *this = getDefault();
        }

        /* preset all fields to empty */
        language[0] = script[0] = country[0] = 0;

        // "canonicalize" the locale ID to ICU/Java format
        err = U_ZERO_ERROR;
        length = canonicalize ?
            uloc_canonicalize(localeID, fullName, sizeof(fullNameBuffer), &err) :
            uloc_getName(localeID, fullName, sizeof(fullNameBuffer), &err);

        if(err == U_BUFFER_OVERFLOW_ERROR || length >= (int32_t)sizeof(fullNameBuffer)) {
            /*Go to heap for the fullName if necessary*/
            fullName = (char *)uprv_malloc(sizeof(char)*(length + 1));
            if(fullName == 0) {
                fullName = fullNameBuffer;
                break; // error: out of memory
            }
            err = U_ZERO_ERROR;
            length = canonicalize ?
                uloc_canonicalize(localeID, fullName, length+1, &err) :
                uloc_getName(localeID, fullName, length+1, &err);
        }
        if(U_FAILURE(err) || err == U_STRING_NOT_TERMINATED_WARNING) {
            /* should never occur */
            break;
        }

        variantBegin = length;

        /* after uloc_getName/canonicalize() we know that only '_' are separators */
        separator = field[0] = fullName;
        fieldIdx = 1;
        while ((separator = uprv_strchr(field[fieldIdx-1], SEP_CHAR)) != 0 && fieldIdx < UPRV_LENGTHOF(field)-1) {
            field[fieldIdx] = separator + 1;
            fieldLen[fieldIdx-1] = (int32_t)(separator - field[fieldIdx-1]);
            fieldIdx++;
        }
        // variant may contain @foo or .foo POSIX cruft; remove it
        separator = uprv_strchr(field[fieldIdx-1], '@');
        char* sep2 = uprv_strchr(field[fieldIdx-1], '.');
        if (separator!=NULL || sep2!=NULL) {
            if (separator==NULL || (sep2!=NULL && separator > sep2)) {
                separator = sep2;
            }
            fieldLen[fieldIdx-1] = (int32_t)(separator - field[fieldIdx-1]);
        } else {
            fieldLen[fieldIdx-1] = length - (int32_t)(field[fieldIdx-1] - fullName);
        }

        if (fieldLen[0] >= (int32_t)(sizeof(language)))
        {
            break; // error: the language field is too long
        }

        variantField = 1; /* Usually the 2nd one, except when a script or country is also used. */
        if (fieldLen[0] > 0) {
            /* We have a language */
            uprv_memcpy(language, fullName, fieldLen[0]);
            language[fieldLen[0]] = 0;
        }
        if (fieldLen[1] == 4 && ISASCIIALPHA(field[1][0]) &&
                ISASCIIALPHA(field[1][1]) && ISASCIIALPHA(field[1][2]) &&
                ISASCIIALPHA(field[1][3])) {
            /* We have at least a script */
            uprv_memcpy(script, field[1], fieldLen[1]);
            script[fieldLen[1]] = 0;
            variantField++;
        }

        if (fieldLen[variantField] == 2 || fieldLen[variantField] == 3) {
            /* We have a country */
            uprv_memcpy(country, field[variantField], fieldLen[variantField]);
            country[fieldLen[variantField]] = 0;
            variantField++;
        } else if (fieldLen[variantField] == 0) {
            variantField++; /* script or country empty but variant in next field (i.e. en__POSIX) */
        }

        if (fieldLen[variantField] > 0) {
            /* We have a variant */
            variantBegin = (int32_t)(field[variantField] - fullName);
        }

        err = U_ZERO_ERROR;
        initBaseName(err);
        if (U_FAILURE(err)) {
            break;
        }

        // successful end of init()
        return *this;
    } while(0); /*loop doesn't iterate*/

    // when an error occurs, then set this object to "bogus" (there is no UErrorCode here)
    setToBogus();

    return *this;
}